

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.cpp
# Opt level: O3

double __thiscall
mp::
BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
::maxErrorRelAbove1(BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
                    *this,double x0,double y0,double x1,double y1)

{
  Error *pEVar1;
  array<double,_2UL> *pt;
  _Alloc_hider _Var2;
  double *in_R8;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  undefined1 *extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double dVar3;
  double extraout_XMM0_Qa_05;
  undefined1 *extraout_XMM0_Qa_06;
  double dVar4;
  double extraout_XMM0_Qa_07;
  undefined1 *extraout_XMM0_Qa_08;
  double extraout_XMM0_Qa_09;
  double extraout_XMM0_Qa_10;
  double dVar5;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> points;
  array<double,_2UL> local_b0;
  double local_a0;
  string local_98;
  double local_78;
  double local_70;
  double local_68;
  undefined8 uStack_60;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  
  local_a0 = x0;
  local_70 = y0;
  local_68 = y1;
  local_50 = x1;
  local_28 = x1;
  local_20 = x0;
  if (x1 <= x0) {
    pEVar1 = (Error *)__cxa_allocate_exception(0x18);
    fmt::format<double,double>
              (&local_98,(fmt *)"PLApprox maxErrRel(): degenerate segment, x0>=x1: {}, {}",
               (CStringRef)&local_20,&local_28,in_R8);
    Error::Error(pEVar1,(CStringRef)local_98._M_dataplus._M_p,-1);
    __cxa_throw(pEVar1,&Error::typeinfo,fmt::SystemError::~SystemError);
  }
  if (0.0 < this->laPrm_->ubErr) {
    local_98._M_dataplus._M_p = (pointer)0x0;
    local_98._M_string_length = 0;
    local_98.field_2._M_allocated_capacity = 0;
    (*this->_vptr_BasicPLApproximator[9])(x0,this);
    local_40 = extraout_XMM0_Qa;
    (*this->_vptr_BasicPLApproximator[9])(local_50,this);
    local_b0._M_elems[0] = local_40;
    local_b0._M_elems[1] = local_70;
    local_48 = extraout_XMM0_Qa_00;
    if (local_98._M_string_length == local_98.field_2._M_allocated_capacity) {
      std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>::
      _M_realloc_insert<std::array<double,2ul>>
                ((vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>> *)&local_98,
                 (iterator)local_98._M_string_length,&local_b0);
    }
    else {
      *(double *)local_98._M_string_length = local_40;
      ((double *)local_98._M_string_length)[1] = local_70;
      local_98._M_string_length = local_98._M_string_length + 0x10;
    }
    local_b0._M_elems[0] = local_48;
    local_b0._M_elems[1] = local_68;
    if (local_98._M_string_length == local_98.field_2._M_allocated_capacity) {
      std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>::
      _M_realloc_insert<std::array<double,2ul>>
                ((vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>> *)&local_98,
                 (iterator)local_98._M_string_length,&local_b0);
    }
    else {
      *(double *)local_98._M_string_length = local_48;
      ((double *)local_98._M_string_length)[1] = local_68;
      local_98._M_string_length = local_98._M_string_length + 0x10;
    }
    local_68 = (local_68 - local_70) / (local_50 - local_a0);
    (*this->_vptr_BasicPLApproximator[0x20])(this);
    local_78 = extraout_XMM0_Qa_01;
    (*this->_vptr_BasicPLApproximator[9])(this);
    local_b0._M_elems[1] = (local_78 - local_a0) * local_68 + local_70;
    local_b0._M_elems[0] = (double)extraout_XMM0_Qa_02;
    if (local_98._M_string_length == local_98.field_2._M_allocated_capacity) {
      std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>::
      _M_realloc_insert<std::array<double,2ul>>
                ((vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>> *)&local_98,
                 (iterator)local_98._M_string_length,&local_b0);
    }
    else {
      *(double *)local_98._M_string_length = (double)extraout_XMM0_Qa_02;
      ((double *)local_98._M_string_length)[1] = local_b0._M_elems[1];
      local_98._M_string_length = local_98._M_string_length + 0x10;
    }
    (*this->_vptr_BasicPLApproximator[0xb])(local_a0,this);
    local_78 = extraout_XMM0_Qa_03;
    (*this->_vptr_BasicPLApproximator[0xb])(local_50,this);
    dVar4 = extraout_XMM0_Qa_04;
    if (local_78 <= extraout_XMM0_Qa_04) {
      dVar4 = local_78;
      local_78 = extraout_XMM0_Qa_04;
    }
    dVar5 = this->laPrm_->ubErr;
    dVar3 = local_68 / (dVar5 + 1.0);
    local_30 = local_78;
    if ((dVar4 <= dVar3) && (dVar3 <= local_78)) {
      (*this->_vptr_BasicPLApproximator[0x20])(this);
      local_78 = dVar4;
      local_38 = extraout_XMM0_Qa_05;
      (*this->_vptr_BasicPLApproximator[9])(this);
      local_b0._M_elems[1] = (local_38 - local_a0) * local_68 + local_70;
      local_b0._M_elems[0] = (double)extraout_XMM0_Qa_06;
      if (local_98._M_string_length == local_98.field_2._M_allocated_capacity) {
        std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>::
        _M_realloc_insert<std::array<double,2ul>>
                  ((vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>> *)
                   &local_98,(iterator)local_98._M_string_length,&local_b0);
      }
      else {
        *(double *)local_98._M_string_length = (double)extraout_XMM0_Qa_06;
        ((double *)local_98._M_string_length)[1] = local_b0._M_elems[1];
        local_98._M_string_length = local_98._M_string_length + 0x10;
      }
      dVar5 = this->laPrm_->ubErr;
      dVar4 = local_78;
    }
    local_78 = dVar4;
    if ((((dVar5 != 1.0) || (NAN(dVar5))) && (dVar4 = local_68 / (1.0 - dVar5), local_78 <= dVar4))
       && (dVar4 <= local_30)) {
      (*this->_vptr_BasicPLApproximator[0x20])(this);
      local_78 = extraout_XMM0_Qa_07;
      (*this->_vptr_BasicPLApproximator[9])(this);
      local_b0._M_elems[1] = (local_78 - local_a0) * local_68 + local_70;
      local_b0._M_elems[0] = (double)extraout_XMM0_Qa_08;
      if (local_98._M_string_length == local_98.field_2._M_allocated_capacity) {
        std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>::
        _M_realloc_insert<std::array<double,2ul>>
                  ((vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>> *)
                   &local_98,(iterator)local_98._M_string_length,&local_b0);
      }
      else {
        *(double *)local_98._M_string_length = (double)extraout_XMM0_Qa_08;
        ((double *)local_98._M_string_length)[1] = local_b0._M_elems[1];
        local_98._M_string_length = local_98._M_string_length + 0x10;
      }
    }
    if ((local_40 < 1.0) && (1.0 < local_48)) {
      (*this->_vptr_BasicPLApproximator[0x1f])(0x3ff0000000000000,this);
      if ((extraout_XMM0_Qa_09 <= local_a0) || (local_50 <= extraout_XMM0_Qa_09)) {
        pEVar1 = (Error *)__cxa_allocate_exception(0x18);
        Error::Error(pEVar1,(CStringRef)0x4bc1af,-1);
        __cxa_throw(pEVar1,&Error::typeinfo,fmt::SystemError::~SystemError);
      }
      local_b0._M_elems[0] = 1.0;
      local_b0._M_elems[1] = (extraout_XMM0_Qa_09 - local_a0) * local_68 + local_70;
      if (local_98._M_string_length == local_98.field_2._M_allocated_capacity) {
        std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>::
        _M_realloc_insert<std::array<double,2ul>>
                  ((vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>> *)
                   &local_98,(iterator)local_98._M_string_length,&local_b0);
      }
      else {
        *(double *)local_98._M_string_length = 1.0;
        ((double *)local_98._M_string_length)[1] = local_b0._M_elems[1];
        local_98._M_string_length = local_98._M_string_length + 0x10;
      }
    }
    if ((local_40 < -1.0) && (-1.0 < local_48)) {
      (*this->_vptr_BasicPLApproximator[0x1f])(&DAT_bff0000000000000,this);
      if ((extraout_XMM0_Qa_10 <= local_a0) || (local_50 <= extraout_XMM0_Qa_10)) {
        pEVar1 = (Error *)__cxa_allocate_exception(0x18);
        Error::Error(pEVar1,(CStringRef)0x4bc1d8,-1);
        __cxa_throw(pEVar1,&Error::typeinfo,fmt::SystemError::~SystemError);
      }
      local_b0._M_elems[0] = (double)&DAT_bff0000000000000;
      local_b0._M_elems[1] = (extraout_XMM0_Qa_10 - local_a0) * local_68 + local_70;
      if (local_98._M_string_length == local_98.field_2._M_allocated_capacity) {
        std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>::
        _M_realloc_insert<std::array<double,2ul>>
                  ((vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>> *)
                   &local_98,(iterator)local_98._M_string_length,&local_b0);
      }
      else {
        *(double *)local_98._M_string_length = (double)&DAT_bff0000000000000;
        ((double *)local_98._M_string_length)[1] = local_b0._M_elems[1];
        local_98._M_string_length = local_98._M_string_length + 0x10;
      }
    }
    if (local_98._M_dataplus._M_p == (pointer)local_98._M_string_length) {
      local_68 = 0.0;
    }
    else {
      local_68 = 0.0;
      _Var2._M_p = local_98._M_dataplus._M_p;
      do {
        dVar4 = ((array<double,_2UL> *)_Var2._M_p)->_M_elems[0];
        dVar5 = dVar4 - ((array<double,_2UL> *)_Var2._M_p)->_M_elems[1];
        dVar4 = ABS((double)(~-(ulong)(1.0 < ABS(dVar4)) & (ulong)dVar5 |
                            (ulong)(dVar5 / dVar4) & -(ulong)(1.0 < ABS(dVar4))));
        if (dVar4 <= local_68) {
          dVar4 = local_68;
        }
        local_68 = dVar4;
        _Var2._M_p = _Var2._M_p + 0x10;
      } while (_Var2._M_p != (pointer)local_98._M_string_length);
    }
    if ((array<double,_2UL> *)local_98._M_dataplus._M_p != (array<double,_2UL> *)0x0) {
      uStack_60 = 0;
      operator_delete(local_98._M_dataplus._M_p,
                      local_98.field_2._M_allocated_capacity - (long)local_98._M_dataplus._M_p);
    }
    return local_68;
  }
  pEVar1 = (Error *)__cxa_allocate_exception(0x18);
  Error::Error(pEVar1,(CStringRef)0x4bc190,-1);
  __cxa_throw(pEVar1,&Error::typeinfo,fmt::SystemError::~SystemError);
}

Assistant:

double BasicPLApproximator<FuncCon>::maxErrorRelAbove1(
    double x0, double y0, double x1, double y1) {
  MP_ASSERT_ALWAYS(x1>x0,
                   fmt::format(
                     "PLApprox maxErrRel(): degenerate segment,"
                     " x0>=x1: {}, {}", x0, x1));
  MP_ASSERT_ALWAYS(laPrm_.ubErr>0.0,
                   "PLApprox maxErrRel(): ubErr<=0");
  std::vector< std::array<double, 2> > points;
  auto f0 = eval(x0);
  auto f1 = eval(x1);
  points.push_back({f0, y0});
  points.push_back({f1, y1});
  auto slope = (y1-y0)/(x1-x0);        // segment slope
  auto xMid = inverse_1st_with_check( slope );    // middle-value point
  points.push_back( { eval(xMid), y0 + (xMid-x0) * slope } );
  /// Assuming f' is monotone on the subinterval,
  /// check points of tilted slope assuming they are present.
  /// An alternative to evaluating f' on the endpoints
  /// would be to have a domain/subintervals for f'.
  auto fp0 = eval_1st(x0);
  auto fp1 = eval_1st(x1);
  if (fp0>fp1)
    std::swap(fp0, fp1);
  {
    auto slopeTiltedAway = slope / (1+laPrm_.ubErr);
    if (slopeTiltedAway>=fp0 && slopeTiltedAway<=fp1) {
      auto xMidUp = inverse_1st_with_check( slopeTiltedAway );
      points.push_back( { eval(xMidUp), y0 + (xMidUp-x0) * slope } );
    }
  }
  if (1.0!=laPrm_.ubErr) {
    auto slopeTiltedTo = slope / (1-laPrm_.ubErr);
    if (slopeTiltedTo>=fp0 && slopeTiltedTo<=fp1) {
      auto xMidDn = inverse_1st_with_check( slopeTiltedTo );
      points.push_back( { eval(xMidDn), y0 + (xMidDn-x0) * slope } );
    }
  }
  if (f0<1.0 && f1>1.0) {
    auto x_preim_1 = inverse_with_check(1.0);
    MP_ASSERT_ALWAYS(x0<x_preim_1 && x1>x_preim_1,
                     "PLApprox maxErrRel(): preim(1.0) outside");
    points.push_back( { 1.0, y0 + (x_preim_1-x0) * slope } );
  }
  if (f0<-1.0 && f1>-1.0) {
    auto x_preim_1 = inverse_with_check(-1.0);
    MP_ASSERT_ALWAYS(x0<x_preim_1 && x1>x_preim_1,
                     "PLApprox maxErrRel(): preim(-1.0) outside");
    points.push_back( { -1.0, y0 + (x_preim_1-x0) * slope } );
  }
  /// Check rel / abs errors in these points
  double errMax=0.0;
  for (const auto& pt: points) {
    auto f=pt[0];
    auto y=pt[1];
    auto err = (f>=-1.0 && f<=1.0) ?
          std::fabs(f-y) :                    // abs error in -1..1
          std::fabs(f-y) / std::fabs(f);      // rel error otherwise
    errMax = std::max(errMax, err);
  }
  return errMax;
}